

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTree::RemoveRect(ON_RTree *this,ON_RTreeBBox *a_rect,ON__INT_PTR a_id,ON_RTreeNode **a_root)

{
  ON_RTreeNode **ppOVar1;
  ON_RTreeListNode *list_node;
  bool bVar2;
  ON_RTreeListNode *remLNode;
  ON_RTreeListNode *pOStack_40;
  int index;
  ON_RTreeListNode *reInsertList;
  ON_RTreeNode *tempNode;
  ON_RTreeNode **a_root_local;
  ON__INT_PTR a_id_local;
  ON_RTreeBBox *a_rect_local;
  ON_RTree *this_local;
  
  pOStack_40 = (ON_RTreeListNode *)0x0;
  tempNode = (ON_RTreeNode *)a_root;
  a_root_local = (ON_RTreeNode **)a_id;
  a_id_local = (ON__INT_PTR)a_rect;
  a_rect_local = (ON_RTreeBBox *)this;
  bVar2 = RemoveRectRec(this,a_rect,a_id,*a_root,&stack0xffffffffffffffc0);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    while (pOStack_40 != (ON_RTreeListNode *)0x0) {
      reInsertList = (ON_RTreeListNode *)pOStack_40->m_node;
      for (remLNode._4_4_ = 0; list_node = pOStack_40,
          remLNode._4_4_ < *(int *)((long)&reInsertList->m_next + 4);
          remLNode._4_4_ = remLNode._4_4_ + 1) {
        InsertRect(this,(ON_RTreeBBox *)((long)reInsertList + (long)remLNode._4_4_ * 0x38 + 8),
                   *(ON__INT_PTR *)((long)reInsertList + (long)remLNode._4_4_ * 0x38 + 0x38),
                   (ON_RTreeNode **)tempNode,*(int *)&reInsertList->m_next);
      }
      ppOVar1 = &pOStack_40->m_node;
      pOStack_40 = pOStack_40->m_next;
      ON_RTreeMemPool::FreeNode(&this->m_mem_pool,*ppOVar1);
      ON_RTreeMemPool::FreeListNode(&this->m_mem_pool,list_node);
    }
    if ((*(int *)(*(long *)tempNode + 4) == 1) &&
       (bVar2 = ON_RTreeNode::IsInternalNode(*(ON_RTreeNode **)tempNode), bVar2)) {
      reInsertList = *(ON_RTreeListNode **)(*(long *)tempNode + 0x38);
      ON_RTreeMemPool::FreeNode(&this->m_mem_pool,*(ON_RTreeNode **)tempNode);
      *(ON_RTreeListNode **)tempNode = reInsertList;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTree::RemoveRect(ON_RTreeBBox* a_rect, ON__INT_PTR a_id, ON_RTreeNode** a_root)
{
  ON_RTreeNode* tempNode;
  ON_RTreeListNode* reInsertList = nullptr;

  if(!RemoveRectRec(a_rect, a_id, *a_root, &reInsertList))
  {
    // Found and deleted a data item
    // Reinsert any branches from eliminated nodes
    while(reInsertList)
    {
      tempNode = reInsertList->m_node;

      for(int index = 0; index < tempNode->m_count; ++index)
      {
        InsertRect(&(tempNode->m_branch[index].m_rect),
                   tempNode->m_branch[index].m_id,
                   a_root,
                   tempNode->m_level);
      }
      
      ON_RTreeListNode* remLNode = reInsertList;
      reInsertList = reInsertList->m_next;
      
      m_mem_pool.FreeNode(remLNode->m_node);
      m_mem_pool.FreeListNode(remLNode);
    }
    
    // Check for redundant root (not leaf, 1 child) and eliminate
    if((*a_root)->m_count == 1 && (*a_root)->IsInternalNode())
    {
      tempNode = (*a_root)->m_branch[0].m_child;
      m_mem_pool.FreeNode(*a_root);
      *a_root = tempNode;
    }
    return false;
  }
  else
  {
    return true;
  }
}